

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O2

void __thiscall Param::Param(Param *this,ID *id,Type *type)

{
  Field *this_00;
  string local_60;
  string local_40;
  
  Object::Object(&this->super_Object);
  this->id_ = id;
  this->type_ = type;
  (this->decl_str_)._M_dataplus._M_p = (pointer)&(this->decl_str_).field_2;
  (this->decl_str_)._M_string_length = 0;
  (this->decl_str_).field_2._M_local_buf[0] = '\0';
  if (type == (Type *)0x0) {
    type = Type::Clone(&extern_type_int->super_Type);
    this->type_ = type;
  }
  Type::DataTypeConstRefStr_abi_cxx11_(&local_60,type);
  strfmt_abi_cxx11_(&local_40,"%s %s",local_60._M_dataplus._M_p,(this->id_->name)._M_dataplus._M_p);
  std::__cxx11::string::operator=((string *)&this->decl_str_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = (Field *)operator_new(0xa0);
  ParamField::ParamField((ParamField *)this_00,this);
  this->param_field_ = this_00;
  return;
}

Assistant:

Param::Param(ID* id, Type* type) : id_(id), type_(type)
	{
	if ( ! type_ )
		type_ = extern_type_int->Clone();

	decl_str_ = strfmt("%s %s", type_->DataTypeConstRefStr().c_str(), id_->Name());

	param_field_ = new ParamField(this);
	}